

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

bool __thiscall
Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::operator==
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *this,
          Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *o)

{
  bool bVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  
  lVar2 = (long)this->_cursor - (long)this->_stack;
  if (lVar2 == (long)o->_cursor - (long)o->_stack) {
    bVar3 = true;
    if (this->_cursor != this->_stack) {
      lVar2 = (lVar2 >> 4) * -0x5555555555555555;
      lVar4 = 0;
      do {
        if ((*(int *)((long)&((Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
                               *)(&this->_stack->numeral + 1))->_id + lVar4) !=
             *(int *)((long)&((Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
                               *)(&o->_stack->numeral + 1))->_id + lVar4)) ||
           (bVar1 = Kernel::RationalConstantType::operator==
                              ((RationalConstantType *)
                               ((long)&(this->_stack->numeral)._num._val[0]._mp_alloc + lVar4),
                               (RationalConstantType *)
                               ((long)&(o->_stack->numeral)._num._val[0]._mp_alloc + lVar4)), !bVar1
           )) goto LAB_002e7af6;
        lVar4 = lVar4 + 0x30;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
  }
  else {
LAB_002e7af6:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool operator==(const Stack& o) const
  {
    if(size()!=o.size()) {
      return false;
    }
    size_t sz = size();
    for(size_t i=0; i!=sz; ++i) {
      if((*this)[i]!=o[i]) {
	return false;
      }
    }
    return true;
  }